

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArgumentsObject.cpp
# Opt level: O1

uint32 __thiscall
Js::HeapArgumentsObject::GetNextFormalArgIndex
          (HeapArgumentsObject *this,uint32 index,BOOL enumNonEnumerable,
          PropertyAttributes *attributes)

{
  BOOLEAN BVar1;
  uint32 uVar2;
  uint i;
  
  if (attributes != (PropertyAttributes *)0x0) {
    *attributes = '\x01';
  }
  i = index + 1;
  uVar2 = 0xffffffff;
  if ((i < this->formalCount) &&
     (uVar2 = i, (this->deletedArgs).ptr != (BVSparse<Memory::Recycler> *)0x0)) {
    while ((uVar2 = 0xffffffff, i < this->formalCount &&
           (BVar1 = BVSparse<Memory::Recycler>::Test((this->deletedArgs).ptr,i), uVar2 = i,
           BVar1 != '\0'))) {
      i = i + 1;
    }
  }
  return uVar2;
}

Assistant:

uint32 HeapArgumentsObject::GetNextFormalArgIndex(uint32 index, BOOL enumNonEnumerable, PropertyAttributes* attributes) const
    {
        if (attributes != nullptr)
        {
            *attributes = PropertyEnumerable;
        }

        if ( ++index < formalCount )
        {
            // None of the arguments deleted
            if ( deletedArgs == nullptr )
            {
                return index;
            }

            while ( index < formalCount )
            {
                if (!this->deletedArgs->Test(index))
                {
                    return index;
                }

                index++;
            }
        }

        return JavascriptArray::InvalidIndex;
    }